

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeNext_OR(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  long lVar1;
  Fts5ExprNode *pFVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  long in_RAX;
  long lVar6;
  bool bVar7;
  undefined8 uStack_38;
  
  if (0 < pNode->nChild) {
    lVar1 = pNode->iRowid;
    lVar6 = 0;
    uStack_38 = in_RAX;
    do {
      pFVar2 = pNode->apChild[lVar6];
      bVar7 = true;
      if (pFVar2->bEof == 0) {
        lVar3 = pFVar2->iRowid;
        if (lVar3 == lVar1) {
LAB_001bd903:
          uVar5 = (*pFVar2->xNext)(pExpr,pFVar2,bFromValid,iFrom);
          bVar7 = uVar5 == 0;
          if (!bVar7) {
            pNode->bNomatch = 0;
            uStack_38 = (ulong)uVar5 << 0x20;
          }
        }
        else if (bFromValid != 0) {
          bVar4 = iFrom < lVar3;
          if (pExpr->bDesc == 0) {
            bVar4 = lVar3 < iFrom;
          }
          if (bVar4) goto LAB_001bd903;
        }
      }
      if (!bVar7) {
        return uStack_38._4_4_;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pNode->nChild);
  }
  fts5ExprNodeTest_OR(pExpr,pNode);
  return 0;
}

Assistant:

static int fts5ExprNodeNext_OR(
  Fts5Expr *pExpr, 
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int i;
  i64 iLast = pNode->iRowid;

  for(i=0; i<pNode->nChild; i++){
    Fts5ExprNode *p1 = pNode->apChild[i];
    assert( p1->bEof || fts5RowidCmp(pExpr, p1->iRowid, iLast)>=0 );
    if( p1->bEof==0 ){
      if( (p1->iRowid==iLast) 
       || (bFromValid && fts5RowidCmp(pExpr, p1->iRowid, iFrom)<0)
      ){
        int rc = fts5ExprNodeNext(pExpr, p1, bFromValid, iFrom);
        if( rc!=SQLITE_OK ){
          pNode->bNomatch = 0;
          return rc;
        }
      }
    }
  }

  fts5ExprNodeTest_OR(pExpr, pNode);
  return SQLITE_OK;
}